

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_validate.c
# Opt level: O2

int cfg_validate_strlen(autobuf *out,char *section_name,char *entry_name,char *value,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  sVar2 = strlen(value);
  iVar1 = 0;
  if (len < sVar2) {
    cfg_append_printable_line
              (out,"Value \'%s\' for entry \'%s\' in section %s is longer than %zu characters",value
               ,entry_name,section_name,len);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int
cfg_validate_strlen(
  struct autobuf *out, const char *section_name, const char *entry_name, const char *value, size_t len) {
  if (strlen(value) > len) {
    cfg_append_printable_line(out,
      "Value '%s' for entry '%s'"
      " in section %s is longer than %" PRINTF_SIZE_T_SPECIFIER " characters",
      value, entry_name, section_name, len);
    return -1;
  }
  return 0;
}